

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

bool wasm::ParamUtils::removeParameter
               (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,Index index,
               vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
               vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
               PassRunner *runner)

{
  pointer *this;
  Function *pFVar1;
  Module *this_00;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *this_01;
  Index removedIndex;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *pvVar2;
  bool bVar3;
  size_type sVar4;
  const_reference ppFVar5;
  const_iterator __first;
  const_iterator __last;
  const_iterator __first_00;
  const_iterator __last_00;
  Type type_00;
  reference pvVar6;
  reference ppFVar7;
  ulong uVar8;
  reference pvVar9;
  reference ppCVar10;
  reference ppCVar11;
  ExpressionList *pEVar12;
  Iterator IVar13;
  Iterator local_348;
  Iterator local_338;
  CallRef *local_328;
  CallRef *call_1;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range2_4;
  size_t local_300;
  Iterator local_2f8;
  Call *local_2e8;
  Call *call;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range2_3;
  value_type local_1e8;
  Function *func_3;
  uintptr_t uStack_1d8;
  Index i;
  Index local_1cc;
  Function *local_1c8;
  Function *func_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndexes;
  Type local_178;
  Function *local_170;
  Function *func_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2_1;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_148;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_140;
  const_iterator local_138;
  Type local_130;
  value_type type;
  allocator<wasm::Type> local_111;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_110;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> local_100;
  undefined1 local_f0 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Type paramsType;
  bool typeIsValid;
  bool callRefParamsAreValid;
  Function **ppFStack_80;
  bool callParamsAreValid;
  anon_class_24_3_97fb837d hasBadEffects;
  Function *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  Function *first;
  PassRunner *runner_local;
  Module *module_local;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs_local;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_local;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *pvStack_18;
  Index index_local;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs_local;
  
  first = (Function *)runner;
  runner_local = (PassRunner *)module;
  module_local = (Module *)callRefs;
  callRefs_local = (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)calls;
  calls_local._4_4_ = index;
  pvStack_18 = funcs;
  sVar4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size(funcs);
  if (sVar4 == 0) {
    __assert_fail("funcs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                  ,0x36,
                  "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                 );
  }
  ppFVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                      (pvStack_18,0);
  pvVar2 = pvStack_18;
  pFVar1 = *ppFVar5;
  __end2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin(pvStack_18);
  func = (Function *)std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(pvVar2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                *)&func);
    if (!bVar3) {
      ppFStack_80 = &first;
      hasBadEffects.runner = &runner_local;
      hasBadEffects.module = (Module **)((long)&calls_local + 4);
      __first = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin
                          ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)callRefs_local);
      __last = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                         ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)callRefs_local);
      bVar3 = std::
              none_of<__gnu_cxx::__normal_iterator<wasm::Call*const*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                        ((__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                          )__first._M_current,
                         (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                          )__last._M_current,(anon_class_24_3_97fb837d *)&stack0xffffffffffffff80);
      if (bVar3) {
        __first_00 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::begin
                               ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                                module_local);
        __last_00 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::end
                              ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                               module_local);
        bVar3 = std::
                none_of<__gnu_cxx::__normal_iterator<wasm::CallRef*const*,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>>,wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          ((__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                            )__first_00._M_current,
                           (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                            )__last_00._M_current,
                           (anon_class_24_3_97fb837d *)&stack0xffffffffffffff80);
        if (bVar3) {
          type_00 = Function::getLocalType(pFVar1,calls_local._4_4_);
          bVar3 = TypeUpdating::canHandleAsLocal(type_00);
          if (bVar3) {
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)Function::getParams(pFVar1);
            this = &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
            local_100 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                        wasm::Type::begin((Type *)this);
            local_110 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                        wasm::Type::end((Type *)this);
            std::allocator<wasm::Type>::allocator(&local_111);
            std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                      ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_f0,(Iterator)local_100
                       ,(Iterator)local_110,&local_111);
            std::allocator<wasm::Type>::~allocator(&local_111);
            pvVar6 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                               ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_f0,
                                (ulong)calls_local._4_4_);
            local_130.id = pvVar6->id;
            local_148._M_current =
                 (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                                   ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_f0);
            local_140 = __gnu_cxx::
                        __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                        ::operator+(&local_148,(ulong)calls_local._4_4_);
            __gnu_cxx::
            __normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
            ::__normal_iterator<wasm::Type*>
                      ((__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
                        *)&local_138,&local_140);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::erase
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_f0,local_138);
            pvVar2 = pvStack_18;
            __end2_1 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                                 (pvStack_18);
            func_1 = (Function *)
                     std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(pvVar2);
            while( true ) {
              bVar3 = __gnu_cxx::operator!=
                                (&__end2_1,
                                 (__normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                  *)&func_1);
              if (!bVar3) break;
              ppFVar7 = __gnu_cxx::
                        __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                        ::operator*(&__end2_1);
              pFVar1 = *ppFVar7;
              local_170 = pFVar1;
              Tuple::Tuple((Tuple *)&newIndexes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (TypeList *)local_f0);
              wasm::Type::Type(&local_178,
                               (Tuple *)&newIndexes.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Function::setParams(pFVar1,local_178);
              Tuple::~Tuple((Tuple *)&newIndexes.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Builder::clearLocalNames(local_170);
              __gnu_cxx::
              __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator++(&__end2_1);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_2);
            pvVar2 = pvStack_18;
            __end2_2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                                 (pvStack_18);
            func_2 = (Function *)
                     std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(pvVar2);
            while( true ) {
              bVar3 = __gnu_cxx::operator!=
                                (&__end2_2,
                                 (__normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                  *)&func_2);
              if (!bVar3) break;
              ppFVar7 = __gnu_cxx::
                        __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                        ::operator*(&__end2_2);
              local_1c8 = *ppFVar7;
              uStack_1d8 = local_130.id;
              local_1cc = Builder::addVar(local_1c8,local_130);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_2,
                         &local_1cc);
              __gnu_cxx::
              __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator++(&__end2_2);
            }
            func_3._4_4_ = 0;
            while( true ) {
              uVar8 = (ulong)func_3._4_4_;
              sVar4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size
                                (pvStack_18);
              this_01 = callRefs_local;
              if (sVar4 <= uVar8) break;
              ppFVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                                  (pvStack_18,(ulong)func_3._4_4_);
              local_1e8 = *ppFVar5;
              bVar3 = Importable::imported(&local_1e8->super_Importable);
              if (!bVar3) {
                ppFVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::
                          operator[](pvStack_18,(ulong)func_3._4_4_);
                removedIndex = calls_local._4_4_;
                pFVar1 = *ppFVar5;
                pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    &__range2_2,(ulong)func_3._4_4_);
                removeParameter(std::vector<wasm::Function*,std::allocator<wasm::
                Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::
                Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm
                ::Module*,wasm::PassRunner*)::LocalUpdater::LocalUpdater(wasm::
                Function__unsigned_int_unsigned_int_(&__range2_3,pFVar1,removedIndex,*pvVar9);
                removeParameter::LocalUpdater::~LocalUpdater((LocalUpdater *)&__range2_3);
                TypeUpdating::handleNonDefaultableLocals(local_1e8,(Module *)runner_local);
              }
              func_3._4_4_ = func_3._4_4_ + 1;
            }
            __end2_3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin
                                 ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                                  callRefs_local);
            call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                                     ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)this_01
                                     );
            while( true ) {
              bVar3 = __gnu_cxx::operator!=
                                (&__end2_3,
                                 (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                  *)&call);
              this_00 = module_local;
              if (!bVar3) break;
              ppCVar10 = __gnu_cxx::
                         __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                         ::operator*(&__end2_3);
              local_2e8 = *ppCVar10;
              pEVar12 = &local_2e8->operands;
              IVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                                 (&pEVar12->
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 );
              local_300 = IVar13.index;
              __range2_4 = (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                           IVar13.parent;
              IVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       Iterator::operator+((Iterator *)&__range2_4,(ulong)calls_local._4_4_);
              local_2f8 = IVar13;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                        (&pEVar12->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,IVar13);
              __gnu_cxx::
              __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
              ::operator++(&__end2_3);
            }
            __end2_4 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::begin
                                 ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                                  module_local);
            call_1 = (CallRef *)
                     std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::end
                               ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)this_00
                               );
            while( true ) {
              bVar3 = __gnu_cxx::operator!=
                                (&__end2_4,
                                 (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                                  *)&call_1);
              if (!bVar3) break;
              ppCVar11 = __gnu_cxx::
                         __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                         ::operator*(&__end2_4);
              local_328 = *ppCVar11;
              pEVar12 = &local_328->operands;
              IVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                                 (&pEVar12->
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 );
              local_348 = IVar13;
              IVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       Iterator::operator+(&local_348,(ulong)calls_local._4_4_);
              local_338 = IVar13;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                        (&pEVar12->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,IVar13);
              __gnu_cxx::
              __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
              ::operator++(&__end2_4);
            }
            funcs_local._7_1_ = 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_2);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_f0);
          }
          else {
            funcs_local._7_1_ = 0;
          }
        }
        else {
          funcs_local._7_1_ = 0;
        }
      }
      else {
        funcs_local._7_1_ = 0;
      }
      return (bool)(funcs_local._7_1_ & 1);
    }
    ppFVar7 = __gnu_cxx::
              __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator*(&__end2);
    hasBadEffects.index = (Index *)*ppFVar7;
    bVar3 = HeapType::operator==(&((Function *)hasBadEffects.index)->type,&pFVar1->type);
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("func->type == first->type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                ,0x3a,
                "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
               );
}

Assistant:

bool removeParameter(const std::vector<Function*>& funcs,
                     Index index,
                     const std::vector<Call*>& calls,
                     const std::vector<CallRef*>& callRefs,
                     Module* module,
                     PassRunner* runner) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Check if none of the calls has a param with side effects that we cannot
  // remove (as if we can remove them, we will simply do that when we remove the
  // parameter). Note: flattening the IR beforehand can help here.
  //
  // It would also be bad if we remove a parameter that causes the type of the
  // call to change, like this:
  //
  //  (call $foo
  //    (unreachable))
  //
  // After removing the parameter the type should change from unreachable to
  // something concrete. We could handle this by updating the type and then
  // propagating that out, or by appending an unreachable after the call, but
  // for simplicity just ignore such cases; if we are called again later then
  // if DCE ran meanwhile then we could optimize.
  auto hasBadEffects = [&](auto* call) {
    auto& operands = call->operands;
    bool hasUnremovable =
      EffectAnalyzer(runner->options, *module, operands[index])
        .hasUnremovableSideEffects();
    bool wouldChangeType = call->type == Type::unreachable && !call->isReturn &&
                           operands[index]->type == Type::unreachable;
    return hasUnremovable || wouldChangeType;
  };
  bool callParamsAreValid =
    std::none_of(calls.begin(), calls.end(), [&](Call* call) {
      return hasBadEffects(call);
    });
  if (!callParamsAreValid) {
    return false;
  }
  bool callRefParamsAreValid =
    std::none_of(callRefs.begin(), callRefs.end(), [&](CallRef* call) {
      return hasBadEffects(call);
    });
  if (!callRefParamsAreValid) {
    return false;
  }

  // The type must be valid for us to handle as a local (since we
  // replace the parameter with a local).
  // TODO: if there are no references at all, we can avoid creating a
  //       local
  bool typeIsValid = TypeUpdating::canHandleAsLocal(first->getLocalType(index));
  if (!typeIsValid) {
    return false;
  }

  // We can do it!

  // Remove the parameter from the function. We must add a new local
  // for uses of the parameter, but cannot make it use the same index
  // (in general).
  auto paramsType = first->getParams();
  std::vector<Type> params(paramsType.begin(), paramsType.end());
  auto type = params[index];
  params.erase(params.begin() + index);
  // TODO: parallelize some of these loops?
  for (auto* func : funcs) {
    func->setParams(Type(params));

    // It's cumbersome to adjust local names - TODO don't clear them?
    Builder::clearLocalNames(func);
  }
  std::vector<Index> newIndexes;
  for (auto* func : funcs) {
    newIndexes.push_back(Builder::addVar(func, type));
  }
  // Update local operations.
  struct LocalUpdater : public PostWalker<LocalUpdater> {
    Index removedIndex;
    Index newIndex;
    LocalUpdater(Function* func, Index removedIndex, Index newIndex)
      : removedIndex(removedIndex), newIndex(newIndex) {
      walk(func->body);
    }
    void visitLocalGet(LocalGet* curr) { updateIndex(curr->index); }
    void visitLocalSet(LocalSet* curr) { updateIndex(curr->index); }
    void updateIndex(Index& index) {
      if (index == removedIndex) {
        index = newIndex;
      } else if (index > removedIndex) {
        index--;
      }
    }
  };
  for (Index i = 0; i < funcs.size(); i++) {
    auto* func = funcs[i];
    if (!func->imported()) {
      LocalUpdater(funcs[i], index, newIndexes[i]);
      TypeUpdating::handleNonDefaultableLocals(func, *module);
    }
  }

  // Remove the arguments from the calls.
  for (auto* call : calls) {
    call->operands.erase(call->operands.begin() + index);
  }
  for (auto* call : callRefs) {
    call->operands.erase(call->operands.begin() + index);
  }

  return true;
}